

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_3::collectNamedStructureDefinitions
               (vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> *dst,
               VarType *type)

{
  StructNameEqualPredicate SVar1;
  pointer pSVar2;
  bool bVar3;
  __normal_iterator<const_glu::StructType_**,_std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>_>
  __it;
  int ndx;
  long lVar4;
  __normal_iterator<const_glu::StructType_**,_std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>_>
  _Var5;
  long lVar6;
  _Iter_pred<deqp::gles31::Functional::(anonymous_namespace)::StructNameEqualPredicate> local_48;
  StructType **local_40;
  long local_38;
  
  for (; type->m_type == TYPE_ARRAY; type = (type->m_data).array.elementType) {
  }
  if (type->m_type != TYPE_STRUCT) {
    return;
  }
  if ((((type->m_data).structPtr)->m_typeName)._M_string_length == 0) goto LAB_013caf40;
  __it._M_current =
       (dst->super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_40 = (dst->
             super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  local_48._M_pred.m_name =
       (StructNameEqualPredicate)(((type->m_data).structPtr)->m_typeName)._M_dataplus._M_p;
  lVar4 = (long)local_40 - (long)__it._M_current;
  for (lVar6 = lVar4 >> 5; _Var5._M_current = __it._M_current, 0 < lVar6; lVar6 = lVar6 + -1) {
    local_38 = lVar4;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<deqp::gles31::Functional::(anonymous_namespace)::StructNameEqualPredicate>::
            operator()(&local_48,__it);
    if (bVar3) goto LAB_013caf3a;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<deqp::gles31::Functional::(anonymous_namespace)::StructNameEqualPredicate>::
            operator()(&local_48,
                       (__normal_iterator<const_glu::StructType_**,_std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>_>
                        )(__it._M_current + 1));
    _Var5._M_current = __it._M_current + 1;
    if (bVar3) goto LAB_013caf3a;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<deqp::gles31::Functional::(anonymous_namespace)::StructNameEqualPredicate>::
            operator()(&local_48,
                       (__normal_iterator<const_glu::StructType_**,_std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>_>
                        )(__it._M_current + 2));
    _Var5._M_current = __it._M_current + 2;
    if (bVar3) goto LAB_013caf3a;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<deqp::gles31::Functional::(anonymous_namespace)::StructNameEqualPredicate>::
            operator()(&local_48,
                       (__normal_iterator<const_glu::StructType_**,_std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>_>
                        )(__it._M_current + 3));
    _Var5._M_current = __it._M_current + 3;
    if (bVar3) goto LAB_013caf3a;
    __it._M_current = __it._M_current + 4;
    lVar4 = local_38 + -0x20;
  }
  lVar4 = lVar4 >> 3;
  if (lVar4 == 1) {
LAB_013cafab:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<deqp::gles31::Functional::(anonymous_namespace)::StructNameEqualPredicate>::
            operator()(&local_48,__it);
    _Var5._M_current = local_40;
    if (bVar3) {
      _Var5._M_current = __it._M_current;
    }
  }
  else if (lVar4 == 2) {
LAB_013caf1c:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<deqp::gles31::Functional::(anonymous_namespace)::StructNameEqualPredicate>::
            operator()(&local_48,_Var5);
    if (!bVar3) {
      __it._M_current = _Var5._M_current + 1;
      goto LAB_013cafab;
    }
  }
  else {
    _Var5._M_current = local_40;
    if ((lVar4 == 3) &&
       (bVar3 = __gnu_cxx::__ops::
                _Iter_pred<deqp::gles31::Functional::(anonymous_namespace)::StructNameEqualPredicate>
                ::operator()(&local_48,__it), _Var5._M_current = __it._M_current, !bVar3)) {
      _Var5._M_current = __it._M_current + 1;
      goto LAB_013caf1c;
    }
  }
LAB_013caf3a:
  if (_Var5._M_current !=
      (dst->super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
LAB_013caf40:
  lVar4 = 0x20;
  lVar6 = 0;
  while( true ) {
    SVar1.m_name = (char *)(type->m_data).structPtr;
    pSVar2 = (((vector<glu::StructMember,_std::allocator<glu::StructMember>_> *)
              (SVar1.m_name + 0x20))->
             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((int)(((long)*(pointer *)(SVar1.m_name + 0x28) - (long)pSVar2) / 0x38) <= lVar6) break;
    collectNamedStructureDefinitions
              (dst,(VarType *)((long)&(pSVar2->m_name)._M_dataplus._M_p + lVar4));
    lVar6 = lVar6 + 1;
    lVar4 = lVar4 + 0x38;
  }
  local_48._M_pred.m_name = (StructNameEqualPredicate)(StructNameEqualPredicate)SVar1.m_name;
  std::vector<glu::StructType_const*,std::allocator<glu::StructType_const*>>::
  emplace_back<glu::StructType_const*>
            ((vector<glu::StructType_const*,std::allocator<glu::StructType_const*>> *)dst,
             (StructType **)&local_48);
  return;
}

Assistant:

static void collectNamedStructureDefinitions (std::vector<const glu::StructType*>& dst, const glu::VarType& type)
{
	if (type.isBasicType())
		return;
	else if (type.isArrayType())
		return collectNamedStructureDefinitions(dst, type.getElementType());
	else if (type.isStructType())
	{
		if (type.getStructPtr()->hasTypeName())
		{
			// must be unique (may share the the same struct)
			std::vector<const glu::StructType*>::iterator where = std::find_if(dst.begin(), dst.end(), StructNameEqualPredicate(type.getStructPtr()->getTypeName()));
			if (where != dst.end())
			{
				DE_ASSERT(**where == *type.getStructPtr());

				// identical type has been added already, types of members must be added too
				return;
			}
		}

		// Add types of members first
		for (int ndx = 0; ndx < type.getStructPtr()->getNumMembers(); ++ndx)
			collectNamedStructureDefinitions(dst, type.getStructPtr()->getMember(ndx).getType());

		dst.push_back(type.getStructPtr());
	}
	else
		DE_ASSERT(false);
}